

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::CompactReporter::printTotals(CompactReporter *this,Totals *totals)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  IColourImpl *pIVar4;
  size_t sVar5;
  long lVar6;
  ostream *poVar7;
  char *pcVar8;
  Colour *this_00;
  char *pcVar9;
  Colour colour;
  string qualify_assertions_failed;
  Colour colour_1;
  Colour colour_2;
  Colour local_101;
  char *local_100;
  long local_f8;
  char local_f0 [16];
  char *local_e0;
  long local_d8;
  char local_d0 [16];
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  char local_a8 [16];
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  char local_88 [8];
  char local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  sVar3 = (totals->testCases).failed + (totals->testCases).passed + (totals->testCases).failedButOk;
  if (sVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_StreamingReporterBase).stream,"No tests ran.",0xd);
    return;
  }
  if ((totals->testCases).failed == sVar3) {
    local_101.m_moved = false;
    pIVar4 = Colour::impl();
    (**(code **)(*(long *)pIVar4 + 0x10))(pIVar4,0x12);
    sVar3 = (totals->assertions).failed;
    if (sVar3 == (totals->assertions).passed + sVar3 + (totals->assertions).failedButOk) {
      pcVar8 = "all ";
      if (sVar3 == 2) {
        pcVar8 = "both ";
      }
      pcVar9 = "";
      if (sVar3 != 1) {
        pcVar9 = pcVar8;
      }
      local_100 = local_f0;
      sVar5 = strlen(pcVar9);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,pcVar9,pcVar9 + sVar5);
    }
    else {
      local_100 = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
    }
    poVar7 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Failed ",7);
    sVar3 = (totals->testCases).failed;
    pcVar8 = "all ";
    if (sVar3 == 2) {
      pcVar8 = "both ";
    }
    pcVar9 = "";
    if (sVar3 != 1) {
      pcVar9 = pcVar8;
    }
    local_e0 = local_d0;
    sVar5 = strlen(pcVar9);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar9,pcVar9 + sVar5);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_e0,local_d8);
    sVar3 = (totals->testCases).failed;
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"test case","");
    local_c0 = (undefined1  [8])sVar3;
    local_b8._M_p = local_a8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_70,local_70 + local_68);
    operator<<(poVar7,(pluralise *)local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", failed ",9);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_100,local_f8);
    sVar3 = (totals->assertions).failed;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"assertion","");
    local_98 = (undefined1  [8])sVar3;
    local_90._M_p = local_80;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_50,local_50 + local_48);
    operator<<(poVar7,(pluralise *)local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
    if (local_90._M_p != local_80) {
      operator_delete(local_90._M_p);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if (local_e0 != local_d0) {
      operator_delete(local_e0);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100);
    }
    this_00 = &local_101;
  }
  else {
    sVar3 = (totals->assertions).failed;
    if ((totals->assertions).passed + sVar3 + (totals->assertions).failedButOk == 0) {
      poVar7 = (this->super_StreamingReporterBase).stream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Passed ",7);
      lVar6 = (totals->testCases).failed + (totals->testCases).passed +
              (totals->testCases).failedButOk;
      pcVar8 = "all ";
      if (lVar6 == 2) {
        pcVar8 = "both ";
      }
      pcVar9 = "";
      if (lVar6 != 1) {
        pcVar9 = pcVar8;
      }
      local_98 = (undefined1  [8])local_88;
      sVar5 = strlen(pcVar9);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,pcVar9,pcVar9 + sVar5);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_98,(long)local_90._M_p);
      sVar3 = (totals->testCases).passed;
      sVar1 = (totals->testCases).failed;
      sVar2 = (totals->testCases).failedButOk;
      local_100 = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"test case","");
      local_c0 = (undefined1  [8])(sVar1 + sVar3 + sVar2);
      local_b8._M_p = local_a8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_100,local_100 + local_f8);
      operator<<(poVar7,(pluralise *)local_c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," (no assertions).",0x11);
      if (local_b8._M_p != local_a8) {
        operator_delete(local_b8._M_p);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100);
      }
      if (local_98 == (undefined1  [8])local_88) {
        return;
      }
      operator_delete((void *)local_98);
      return;
    }
    if (sVar3 == 0) {
      local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
      pIVar4 = Colour::impl();
      (**(code **)(*(long *)pIVar4 + 0x10))(pIVar4,0x13);
      poVar7 = (this->super_StreamingReporterBase).stream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Passed ",7);
      sVar3 = (totals->testCases).passed;
      pcVar8 = "all ";
      if (sVar3 == 2) {
        pcVar8 = "both ";
      }
      pcVar9 = "";
      if (sVar3 != 1) {
        pcVar9 = pcVar8;
      }
      local_100 = local_f0;
      sVar5 = strlen(pcVar9);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,pcVar9,pcVar9 + sVar5);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_100,local_f8);
      sVar3 = (totals->testCases).passed;
      local_e0 = local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"test case","");
      local_c0 = (undefined1  [8])sVar3;
      local_b8._M_p = local_a8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_e0,local_e0 + local_d8);
      operator<<(poVar7,(pluralise *)local_c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," with ",6);
      sVar3 = (totals->assertions).passed;
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"assertion","");
      local_98 = (undefined1  [8])sVar3;
      local_90._M_p = local_80;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_70,local_70 + local_68);
      operator<<(poVar7,(pluralise *)local_98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
      if (local_90._M_p != local_80) {
        operator_delete(local_90._M_p);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      if (local_b8._M_p != local_a8) {
        operator_delete(local_b8._M_p);
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100);
      }
      this_00 = (Colour *)&local_50;
    }
    else {
      local_70 = (undefined1 *)((ulong)local_70 & 0xffffffffffffff00);
      pIVar4 = Colour::impl();
      (**(code **)(*(long *)pIVar4 + 0x10))(pIVar4,0x12);
      poVar7 = (this->super_StreamingReporterBase).stream;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Failed ",7);
      sVar3 = (totals->testCases).failed;
      local_100 = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"test case","");
      local_c0 = (undefined1  [8])sVar3;
      local_b8._M_p = local_a8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_100,local_100 + local_f8);
      operator<<(poVar7,(pluralise *)local_c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", failed ",9);
      sVar3 = (totals->assertions).failed;
      local_e0 = local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"assertion","");
      local_98 = (undefined1  [8])sVar3;
      local_90._M_p = local_80;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_e0,local_e0 + local_d8);
      operator<<(poVar7,(pluralise *)local_98);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
      if (local_90._M_p != local_80) {
        operator_delete(local_90._M_p);
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0);
      }
      if (local_b8._M_p != local_a8) {
        operator_delete(local_b8._M_p);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100);
      }
      this_00 = (Colour *)&local_70;
    }
  }
  Colour::~Colour(this_00);
  return;
}

Assistant:

void printTotals( const Totals& totals ) const {
            if( totals.testCases.total() == 0 ) {
                stream << "No tests ran.";
            }
            else if( totals.testCases.failed == totals.testCases.total() ) {
                Colour colour( Colour::ResultError );
                const std::string qualify_assertions_failed =
                    totals.assertions.failed == totals.assertions.total() ?
                        bothOrAll( totals.assertions.failed ) : "";
                stream <<
                    "Failed " << bothOrAll( totals.testCases.failed )
                              << pluralise( totals.testCases.failed, "test case"  ) << ", "
                    "failed " << qualify_assertions_failed <<
                                 pluralise( totals.assertions.failed, "assertion" ) << ".";
            }
            else if( totals.assertions.total() == 0 ) {
                stream <<
                    "Passed " << bothOrAll( totals.testCases.total() )
                              << pluralise( totals.testCases.total(), "test case" )
                              << " (no assertions).";
            }
            else if( totals.assertions.failed ) {
                Colour colour( Colour::ResultError );
                stream <<
                    "Failed " << pluralise( totals.testCases.failed, "test case"  ) << ", "
                    "failed " << pluralise( totals.assertions.failed, "assertion" ) << ".";
            }
            else {
                Colour colour( Colour::ResultSuccess );
                stream <<
                    "Passed " << bothOrAll( totals.testCases.passed )
                              << pluralise( totals.testCases.passed, "test case"  ) <<
                    " with "  << pluralise( totals.assertions.passed, "assertion" ) << ".";
            }
        }